

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[6],char[14]>
          (Capturer *this,size_t index,char (*value) [6],char (*values) [14])

{
  string local_48;
  char (*local_28) [14];
  char (*values_local) [14];
  char (*value_local) [6];
  size_t index_local;
  Capturer *this_local;
  
  local_28 = values;
  values_local = (char (*) [14])value;
  value_local = (char (*) [6])index;
  index_local = (size_t)this;
  Detail::stringify<char[6]>(&local_48,value);
  captureValue(this,index,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  captureValues<char[14]>(this,(size_t)(*value_local + 1),local_28);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }